

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O1

vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *
dgrminer::compute_min_code
          (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
           *__return_storage_ptr__,
          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list)

{
  pointer *ppaVar1;
  vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *this;
  vector<int,std::allocator<int>> *this_00;
  mapped_type mVar2;
  iterator iVar3;
  iterator __position;
  byte bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  iterator __last;
  size_type __n;
  bool bVar9;
  uint uVar10;
  mapped_type *pmVar11;
  pointer paVar12;
  int *piVar13;
  _Elt_pointer piVar14;
  uint uVar15;
  pointer piVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  _Elt_pointer piVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  key_type *__k;
  long lVar24;
  ulong uVar25;
  int i;
  ulong uVar26;
  array<int,_10UL> *paVar27;
  __normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
  _Var28;
  vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
  edge_candidates;
  array<int,_10UL> newedge;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> built_min_code;
  vector<bool,_std::allocator<bool>_> selected_edges;
  vector<int,_std::allocator<int>_> dst_vertices;
  vector<int,_std::allocator<int>_> src_vertices;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  all_edge_candidates_selected_edges_ind;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  amount_of_usage_of_original_vertices;
  array<int,_10UL> built_min_code_edge;
  vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
  all_edge_candidates;
  deque<int,_std::allocator<int>_> right_most_path_occurrence;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> vertex_id_mapping;
  vector<int,_std::allocator<int>_> selected_candidates;
  vector<int,_std::allocator<int>_> selected_edges_ind;
  vector<int,_std::allocator<int>_> indices_of_min_edges;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> starting_edges;
  __normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
  local_2f8;
  iterator iStack_2f0;
  labeled_pattern_edge *local_2e8;
  _Deque_base<int,_std::allocator<int>_> local_2d8;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_288;
  long local_270;
  int local_264;
  vector<bool,_std::allocator<bool>_> local_260;
  ulong local_238;
  long local_230;
  void *local_228;
  iterator iStack_220;
  int *local_218;
  void *local_208;
  iterator iStack_200;
  int *local_1f8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1f0;
  labeled_pattern_edge local_1d4;
  size_type local_1a8;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *local_1a0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_198;
  array<int,_10UL> local_168;
  vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
  local_140;
  _Deque_base<int,_std::allocator<int>_> local_128;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_d8;
  size_type local_a8;
  int *local_a0;
  int *local_98;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = (int)((long)(edge_list->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(edge_list->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3);
  uVar15 = iVar8 * -0x33333333;
  if (0 < (int)uVar15) {
    uVar26 = (ulong)(uVar15 & 0x7fffffff);
    lVar24 = 0x24;
    do {
      paVar12 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_2d8._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           CONCAT44(*(undefined4 *)((long)paVar12->_M_elems + lVar24 + -0x24),
                    *(undefined4 *)((long)paVar12->_M_elems + lVar24 + -0x20));
      local_2d8._M_impl.super__Deque_impl_data._M_map_size =
           CONCAT44(*(undefined4 *)((long)paVar12->_M_elems + lVar24 + -4),
                    *(undefined4 *)((long)paVar12->_M_elems + lVar24 + -8));
      iVar22 = *(int *)((long)paVar12->_M_elems + lVar24 + -0x14);
      if (iVar22 == 1) {
        iVar22 = 2;
      }
      else if (iVar22 == 2) {
        iVar22 = 1;
      }
      local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)CONCAT44(*(undefined4 *)((long)paVar12->_M_elems + lVar24 + -0x10),iVar22);
      local_2d8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_ =
           *(undefined4 *)((long)paVar12->_M_elems + lVar24 + -0xc);
      local_2d8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ =
           *(undefined4 *)((long)paVar12->_M_elems + lVar24 + -0x1c);
      local_2d8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_ =
           *(undefined4 *)((long)paVar12->_M_elems + lVar24 + -0x18);
      local_2d8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_ =
           *(undefined4 *)((long)paVar12->_M_elems + lVar24);
      iVar3._M_current =
           (edge_list->
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (edge_list->
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
        _M_realloc_insert<std::array<int,10ul>>
                  ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)edge_list,
                   iVar3,(array<int,_10UL> *)&local_2d8);
      }
      else {
        *(ulong *)((iVar3._M_current)->_M_elems + 8) =
             CONCAT44(local_2d8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_,
                      local_2d8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_);
        *(_Elt_pointer *)((iVar3._M_current)->_M_elems + 4) =
             local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur;
        *(ulong *)((iVar3._M_current)->_M_elems + 6) =
             CONCAT44(local_2d8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_,
                      local_2d8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_);
        *(_Map_pointer *)(iVar3._M_current)->_M_elems =
             local_2d8._M_impl.super__Deque_impl_data._M_map;
        *(size_t *)((iVar3._M_current)->_M_elems + 2) =
             local_2d8._M_impl.super__Deque_impl_data._M_map_size;
        ppaVar1 = &(edge_list->
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      lVar24 = lVar24 + 0x28;
      uVar26 = uVar26 - 1;
    } while (uVar26 != 0);
  }
  local_48.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  find_minimum_labelings(&local_60,edge_list,&local_48,true);
  local_a0 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar8 = iVar8 * -0x66666666;
    local_a8 = (size_type)iVar8;
    local_1a8 = (size_type)(int)uVar15;
    local_238 = 0x800000000000003f;
    piVar16 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    local_1a0 = __return_storage_ptr__;
    do {
      iVar22 = *piVar16;
      local_168._M_elems[0] = 0;
      local_168._M_elems[1] = 1;
      uVar26 = (ulong)iVar22;
      paVar12 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_168._M_elems[2] = paVar12[uVar26]._M_elems[2];
      local_168._M_elems[3] = paVar12[uVar26]._M_elems[3];
      local_168._M_elems[4] = paVar12[uVar26]._M_elems[4];
      local_168._M_elems[5] = paVar12[uVar26]._M_elems[5];
      local_168._M_elems[6] = paVar12[uVar26]._M_elems[6];
      local_168._M_elems[7] = paVar12[uVar26]._M_elems[7];
      local_168._M_elems[8] = paVar12[uVar26]._M_elems[8];
      local_168._M_elems[9] = paVar12[uVar26]._M_elems[9];
      paVar27 = (__return_storage_ptr__->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_98 = piVar16;
      if (((__return_storage_ptr__->
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish == paVar27) ||
         (bVar9 = is_pattern_edge_smaller_than(paVar27,&local_168,true), !bVar9)) {
        local_288.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_288.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (array<int,_10UL> *)0x0;
        local_288.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (array<int,_10UL> *)0x0;
        std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
        _M_realloc_insert<std::array<int,10ul>const&>
                  ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)&local_288,
                   (iterator)0x0,&local_168);
        __n = local_1a8;
        local_2d8._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)
             ((ulong)local_2d8._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&local_260,local_a8,(bool *)&local_2d8,(allocator_type *)&local_128);
        local_2d8._M_impl.super__Deque_impl_data._M_map._0_4_ = 0xffffffff;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_78,__n,(value_type_conflict1 *)&local_2d8,(allocator_type *)&local_128);
        local_2d8._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)((ulong)local_2d8._M_impl.super__Deque_impl_data._M_map._4_4_ << 0x20);
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_90,__n,(value_type_conflict1 *)&local_2d8,(allocator_type *)&local_128);
        local_2d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        local_2d8._M_impl.super__Deque_impl_data._M_map_size = 0;
        local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        std::
        vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
        ::vector(&local_140,__n,(value_type *)&local_2d8,(allocator_type *)&local_128);
        if (local_2d8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
          operator_delete(local_2d8._M_impl.super__Deque_impl_data._M_map);
        }
        local_2d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        local_2d8._M_impl.super__Deque_impl_data._M_map_size = 0;
        local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector(&local_1f0,__n,(value_type *)&local_2d8,(allocator_type *)&local_128);
        if (local_2d8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
          operator_delete(local_2d8._M_impl.super__Deque_impl_data._M_map);
        }
        *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = iVar22;
        uVar25 = uVar26 + 0x3f;
        if (-1 < (long)uVar26) {
          uVar25 = uVar26;
        }
        local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar25 >> 6) + ((ulong)((uVar26 & local_238) < 0x8000000000000001) - 1)] =
             local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar25 >> 6) + ((ulong)((uVar26 & local_238) < 0x8000000000000001) - 1)] |
             1L << ((byte)iVar22 & 0x3f);
        iVar22 = (int)(uVar15 + iVar22) % iVar8;
        uVar17 = (ulong)iVar22;
        uVar25 = uVar17 + 0x3f;
        if (-1 < (long)uVar17) {
          uVar25 = uVar17;
        }
        local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar25 >> 6) + ((ulong)((uVar17 & local_238) < 0x8000000000000001) - 1)] =
             local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar25 >> 6) + ((ulong)((uVar17 & local_238) < 0x8000000000000001) - 1)] |
             1L << ((byte)iVar22 & 0x3f);
        local_1f8 = (int *)0x0;
        local_208 = (void *)0x0;
        iStack_200._M_current = (int *)0x0;
        local_218 = (int *)0x0;
        local_228 = (void *)0x0;
        iStack_220._M_current = (int *)0x0;
        local_198._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_198._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_198._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_198._M_impl.super__Rb_tree_header._M_header;
        local_198._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_d8._M_impl.super__Rb_tree_header._M_header;
        local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
        mVar2 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar26]._M_elems[0];
        local_2d8._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)
             ((ulong)local_2d8._M_impl.super__Deque_impl_data._M_map & 0xffffffff00000000);
        local_198._M_impl.super__Rb_tree_header._M_header._M_right =
             local_198._M_impl.super__Rb_tree_header._M_header._M_left;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
        pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_d8,(key_type *)&local_2d8);
        *pmVar11 = mVar2;
        mVar2 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar26]._M_elems[1];
        local_2d8._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)CONCAT44(local_2d8._M_impl.super__Deque_impl_data._M_map._4_4_,1);
        pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_d8,(key_type *)&local_2d8);
        *pmVar11 = mVar2;
        paVar12 = (edge_list->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((edge_list->
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
            _M_impl.super__Vector_impl_data._M_finish != paVar12) {
          lVar24 = 4;
          uVar25 = 0;
          do {
            piVar13 = (int *)((long)paVar12->_M_elems + lVar24 + -4);
            if (iStack_200._M_current == local_1f8) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_208,iStack_200,piVar13);
            }
            else {
              *iStack_200._M_current = *piVar13;
              iStack_200._M_current = iStack_200._M_current + 1;
            }
            piVar13 = (int *)((long)((edge_list->
                                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar24)
            ;
            if (iStack_220._M_current == local_218) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_228,iStack_220,piVar13);
            }
            else {
              *iStack_220._M_current = *piVar13;
              iStack_220._M_current = iStack_220._M_current + 1;
            }
            pmVar11 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_198,
                                 (key_type *)
                                 ((long)((edge_list->
                                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                 lVar24 + -4));
            *pmVar11 = 0;
            pmVar11 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_198,
                                 (key_type *)
                                 ((long)((edge_list->
                                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                 lVar24));
            *pmVar11 = 0;
            uVar25 = uVar25 + 1;
            paVar12 = (edge_list->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar17 = ((long)(edge_list->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)paVar12 >> 3) *
                     -0x3333333333333333;
            lVar24 = lVar24 + 0x28;
          } while (uVar25 <= uVar17 && uVar17 - uVar25 != 0);
        }
        pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_198,paVar12[uVar26]._M_elems);
        *pmVar11 = 1;
        pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_198,
                             (edge_list->
                             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar26]._M_elems + 1);
        *pmVar11 = 1;
        iVar22 = 1;
        while( true ) {
          if ((int)uVar15 <= iVar22) {
            if ((__return_storage_ptr__->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_finish ==
                (__return_storage_ptr__->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start) {
              std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                        (__return_storage_ptr__,&local_288);
            }
            else {
              bVar9 = is_code_smaller_than(&local_288,__return_storage_ptr__,true);
              if (bVar9) {
                std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                operator=(__return_storage_ptr__,&local_288);
              }
            }
            iVar22 = iVar22 + -1;
          }
          if (iVar22 == 0) break;
          local_270 = (long)iVar22;
          local_264 = iVar22;
          if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[local_270] == 0) {
            find_rightmost_path((deque<int,_std::allocator<int>_> *)&local_2d8,&local_288);
            local_128._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
            local_128._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
            local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = (mapped_type *)0x0;
            local_128._M_impl.super__Deque_impl_data._M_finish._M_first = (mapped_type *)0x0;
            local_128._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
            local_128._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
            local_128._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
            local_128._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
            local_128._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
            local_128._M_impl.super__Deque_impl_data._M_map_size = 0;
            std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_128,0);
            lVar24 = 0;
            for (uVar26 = 0;
                uVar26 < (CONCAT44(local_2d8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_,
                                   local_2d8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_)
                          - (long)local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 2) +
                         ((long)local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)local_2d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
                         ((((ulong)((long)local_2d8._M_impl.super__Deque_impl_data._M_finish._M_node
                                   - (long)local_2d8._M_impl.super__Deque_impl_data._M_start._M_node
                                   ) >> 3) - 1) +
                         (ulong)(local_2d8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                (_Map_pointer)0x0)) * 0x80; uVar26 = uVar26 + 1) {
              lVar18 = (long)local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur -
                       CONCAT44(local_2d8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_,
                                local_2d8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_) >>
                       2;
              uVar25 = uVar26 + lVar18;
              if (uVar25 < 0x80) {
                __k = (key_type *)
                      ((long)local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur + lVar24);
              }
              else {
                uVar17 = uVar25 >> 7 | 0xfe00000000000000;
                if (0 < (long)uVar25) {
                  uVar17 = uVar25 >> 7;
                }
                __k = local_2d8._M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                      lVar18 + uVar17 * -0x80 + uVar26;
              }
              pmVar11 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&local_d8,__k);
              if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_128._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                          ((deque<int,std::allocator<int>> *)&local_128,pmVar11);
              }
              else {
                *local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = *pmVar11;
                local_128._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_128._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              lVar24 = lVar24 + 4;
            }
            piVar14 = local_128._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_128._M_impl.super__Deque_impl_data._M_finish._M_first) {
              piVar14 = local_128._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
            }
            iVar22 = piVar14[-1];
            local_2f8._M_current = (labeled_pattern_edge *)0x0;
            iStack_2f0._M_current = (labeled_pattern_edge *)0x0;
            local_2e8 = (labeled_pattern_edge *)0x0;
            uVar26 = 0;
            while( true ) {
              lVar24 = local_270;
              lVar18 = ((long)local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)local_2d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
                       ((((ulong)((long)local_2d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                                 (long)local_2d8._M_impl.super__Deque_impl_data._M_start._M_node) >>
                         3) - 1) +
                       (ulong)(local_2d8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                              (_Map_pointer)0x0)) * 0x80;
              lVar19 = CONCAT44(local_2d8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_,
                                local_2d8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_) -
                       (long)local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 2;
              if ((lVar19 + lVar18) - 1U <= uVar26) break;
              uVar25 = ((long)local_128._M_impl.super__Deque_impl_data._M_start._M_cur -
                        (long)local_128._M_impl.super__Deque_impl_data._M_start._M_first >> 2) +
                       uVar26;
              if (uVar25 < 0x80) {
                piVar13 = local_128._M_impl.super__Deque_impl_data._M_start._M_cur + uVar26;
              }
              else {
                uVar17 = uVar25 >> 7 | 0xfe00000000000000;
                if (0 < (long)uVar25) {
                  uVar17 = uVar25 >> 7;
                }
                piVar13 = local_128._M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                          uVar25 + uVar17 * -0x80;
              }
              if (((long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                  (ulong)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0)
              {
                iVar23 = *piVar13;
                lVar24 = 9;
                uVar25 = 0;
                do {
                  if ((((local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [uVar25 >> 6] >> (uVar25 & 0x3f) & 1) == 0) &&
                      (*(int *)((long)local_208 + uVar25 * 4) == iVar22)) &&
                     (*(int *)((long)local_228 + uVar25 * 4) == iVar23)) {
                    piVar14 = local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                    if (local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_2d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                      piVar14 = local_2d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] +
                                0x80;
                    }
                    uVar17 = ((long)local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur -
                              CONCAT44(local_2d8._M_impl.super__Deque_impl_data._M_start._M_first.
                                       _4_4_,local_2d8._M_impl.super__Deque_impl_data._M_start.
                                             _M_first._0_4_) >> 2) + uVar26;
                    if (uVar17 < 0x80) {
                      piVar13 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur + uVar26;
                    }
                    else {
                      uVar21 = uVar17 >> 7 | 0xfe00000000000000;
                      if (0 < (long)uVar17) {
                        uVar21 = uVar17 >> 7;
                      }
                      piVar13 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_node[uVar21] +
                                uVar17 + uVar21 * -0x80;
                    }
                    local_1d4.elements._M_elems[0] = piVar14[-1];
                    local_1d4.elements._M_elems[1] = *piVar13;
                    paVar12 = (edge_list->
                              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    piVar13 = paVar12->_M_elems + lVar24 + -7;
                    local_1d4.elements._M_elems._8_8_ = *(undefined8 *)piVar13;
                    local_1d4.elements._M_elems._16_8_ = *(undefined8 *)(piVar13 + 2);
                    piVar13 = paVar12->_M_elems + lVar24 + -3;
                    uVar5 = *(undefined8 *)piVar13;
                    uVar6 = *(undefined8 *)(piVar13 + 2);
                    local_1d4.elements._M_elems[6] = (int)uVar5;
                    local_1d4.elements._M_elems[7] = (int)((ulong)uVar5 >> 0x20);
                    local_1d4.elements._M_elems[8] = (int)uVar6;
                    local_1d4.elements._M_elems[9] = (int)((ulong)uVar6 >> 0x20);
                    local_1d4.index = (int)uVar25;
                    if (iStack_2f0._M_current == local_2e8) {
                      std::
                      vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                      ::_M_realloc_insert<dgrminer::labeled_pattern_edge_const&>
                                ((vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                                  *)&local_2f8,iStack_2f0,&local_1d4);
                    }
                    else {
                      *(ulong *)(((iStack_2f0._M_current)->elements)._M_elems + 7) =
                           CONCAT44(local_1d4.elements._M_elems[8],local_1d4.elements._M_elems[7]);
                      *(ulong *)(((iStack_2f0._M_current)->elements)._M_elems + 9) =
                           CONCAT44(local_1d4.index,local_1d4.elements._M_elems[9]);
                      *(undefined8 *)(((iStack_2f0._M_current)->elements)._M_elems + 4) =
                           local_1d4.elements._M_elems._16_8_;
                      *(undefined8 *)(((iStack_2f0._M_current)->elements)._M_elems + 6) = uVar5;
                      *(ulong *)((iStack_2f0._M_current)->elements)._M_elems =
                           CONCAT44(local_1d4.elements._M_elems[1],local_1d4.elements._M_elems[0]);
                      *(undefined8 *)(((iStack_2f0._M_current)->elements)._M_elems + 2) =
                           local_1d4.elements._M_elems._8_8_;
                      iStack_2f0._M_current = iStack_2f0._M_current + 1;
                    }
                  }
                  uVar25 = uVar25 + 1;
                  lVar24 = lVar24 + 10;
                } while (uVar25 < (ulong)local_260.super__Bvector_base<std::allocator<bool>_>.
                                         _M_impl.super__Bvector_impl_data._M_finish.
                                         super__Bit_iterator_base._M_offset +
                                  ((long)local_260.super__Bvector_base<std::allocator<bool>_>.
                                         _M_impl.super__Bvector_impl_data._M_finish.
                                         super__Bit_iterator_base._M_p -
                                  (long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl
                                        .super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                        _M_p) * 8);
              }
              uVar26 = uVar26 + 1;
            }
            uVar10 = ((int)lVar18 + (int)lVar19) - 1;
            if (-1 < (int)uVar10) {
              uVar26 = (ulong)uVar10;
              do {
                uVar25 = ((long)local_128._M_impl.super__Deque_impl_data._M_start._M_cur -
                          (long)local_128._M_impl.super__Deque_impl_data._M_start._M_first >> 2) +
                         uVar26;
                if (uVar25 < 0x80) {
                  piVar13 = local_128._M_impl.super__Deque_impl_data._M_start._M_cur + uVar26;
                }
                else {
                  uVar17 = uVar25 >> 7 | 0xfe00000000000000;
                  if (0 < (long)uVar25) {
                    uVar17 = uVar25 >> 7;
                  }
                  piVar13 = local_128._M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                            uVar25 + uVar17 * -0x80;
                }
                if (((long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                    (ulong)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset !=
                    0) {
                  iVar22 = *piVar13;
                  uVar25 = 0;
                  do {
                    if ((((local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [uVar25 >> 6] >> (uVar25 & 0x3f) & 1) == 0) &&
                        (*(int *)((long)local_208 + uVar25 * 4) == iVar22)) &&
                       (pmVar11 = std::
                                  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                *)&local_198,
                                               (key_type *)(uVar25 * 4 + (long)local_228)),
                       *pmVar11 == 0)) {
                      uVar17 = ((long)local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur -
                                CONCAT44(local_2d8._M_impl.super__Deque_impl_data._M_start._M_first.
                                         _4_4_,local_2d8._M_impl.super__Deque_impl_data._M_start.
                                               _M_first._0_4_) >> 2) + uVar26;
                      if (uVar17 < 0x80) {
                        piVar14 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur + uVar26;
                      }
                      else {
                        uVar21 = uVar17 >> 7 | 0xfe00000000000000;
                        if (0 < (long)uVar17) {
                          uVar21 = uVar17 >> 7;
                        }
                        piVar14 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_node[uVar21]
                                  + uVar17 + uVar21 * -0x80;
                      }
                      piVar20 = local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                      if (local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          local_2d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                        piVar20 = local_2d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] +
                                  0x80;
                      }
                      local_1d4.elements._M_elems[0] = *piVar14;
                      local_1d4.elements._M_elems[1] = piVar20[-1] + 1;
                      paVar12 = (edge_list->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      piVar13 = paVar12[uVar25]._M_elems + 2;
                      local_1d4.elements._M_elems._8_8_ = *(undefined8 *)piVar13;
                      local_1d4.elements._M_elems._16_8_ = *(undefined8 *)(piVar13 + 2);
                      piVar13 = paVar12[uVar25]._M_elems + 6;
                      uVar5 = *(undefined8 *)piVar13;
                      uVar6 = *(undefined8 *)(piVar13 + 2);
                      local_1d4.elements._M_elems[6] = (int)uVar5;
                      local_1d4.elements._M_elems[7] = (int)((ulong)uVar5 >> 0x20);
                      local_1d4.elements._M_elems[8] = (int)uVar6;
                      local_1d4.elements._M_elems[9] = (int)((ulong)uVar6 >> 0x20);
                      local_1d4.index = (int)uVar25;
                      if (iStack_2f0._M_current == local_2e8) {
                        std::
                        vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                        ::_M_realloc_insert<dgrminer::labeled_pattern_edge_const&>
                                  ((vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                                    *)&local_2f8,iStack_2f0,&local_1d4);
                      }
                      else {
                        *(ulong *)(((iStack_2f0._M_current)->elements)._M_elems + 7) =
                             CONCAT44(local_1d4.elements._M_elems[8],local_1d4.elements._M_elems[7])
                        ;
                        *(ulong *)(((iStack_2f0._M_current)->elements)._M_elems + 9) =
                             CONCAT44(local_1d4.index,local_1d4.elements._M_elems[9]);
                        *(undefined8 *)(((iStack_2f0._M_current)->elements)._M_elems + 4) =
                             local_1d4.elements._M_elems._16_8_;
                        *(undefined8 *)(((iStack_2f0._M_current)->elements)._M_elems + 6) = uVar5;
                        *(ulong *)((iStack_2f0._M_current)->elements)._M_elems =
                             CONCAT44(local_1d4.elements._M_elems[1],local_1d4.elements._M_elems[0])
                        ;
                        *(undefined8 *)(((iStack_2f0._M_current)->elements)._M_elems + 2) =
                             local_1d4.elements._M_elems._8_8_;
                        iStack_2f0._M_current = iStack_2f0._M_current + 1;
                      }
                    }
                    uVar25 = uVar25 + 1;
                  } while (uVar25 < (ulong)local_260.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_finish.
                                           super__Bit_iterator_base._M_offset +
                                    ((long)local_260.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_finish.
                                           super__Bit_iterator_base._M_p -
                                    (long)local_260.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_start.
                                          super__Bit_iterator_base._M_p) * 8);
                }
                bVar9 = 0 < (long)uVar26;
                uVar26 = uVar26 - 1;
              } while (bVar9);
            }
            __last._M_current = iStack_2f0._M_current;
            _Var28._M_current = local_2f8._M_current;
            if (local_2f8._M_current != iStack_2f0._M_current) {
              uVar26 = ((long)iStack_2f0._M_current - (long)local_2f8._M_current >> 2) *
                       0x2e8ba2e8ba2e8ba3;
              lVar18 = 0x3f;
              if (uVar26 != 0) {
                for (; uVar26 >> lVar18 == 0; lVar18 = lVar18 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<dgrminer::labeled_pattern_edge*,std::vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(dgrminer::labeled_pattern_edge_const&,dgrminer::labeled_pattern_edge_const&)>>
                        (local_2f8,
                         (__normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
                          )iStack_2f0._M_current,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,
                         (_Iter_comp_iter<bool_(*)(const_dgrminer::labeled_pattern_edge_&,_const_dgrminer::labeled_pattern_edge_&)>
                          )0x12091f);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<dgrminer::labeled_pattern_edge*,std::vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(dgrminer::labeled_pattern_edge_const&,dgrminer::labeled_pattern_edge_const&)>>
                        (_Var28,(__normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
                                 )__last._M_current,
                         (_Iter_comp_iter<bool_(*)(const_dgrminer::labeled_pattern_edge_&,_const_dgrminer::labeled_pattern_edge_&)>
                          )0x12091f);
            }
            paVar12 = local_140.
                      super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar24].
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_140.
                super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar24].
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish != paVar12) {
              local_140.
              super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar24].
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = paVar12;
            }
            piVar16 = local_1f0.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar24].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            if (local_1f0.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar24].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish != piVar16) {
              local_1f0.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar24].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = piVar16;
            }
            _Var28._M_current = local_2f8._M_current;
            if (iStack_2f0._M_current != local_2f8._M_current) {
              lVar18 = 0;
              uVar26 = 0;
              do {
                _Var28._M_current = local_2f8._M_current;
                if ((uVar26 != 0) &&
                   (bVar9 = is_pattern_edge_smaller_than
                                      ((array<int,_10UL> *)
                                       ((long)local_2f8._M_current[-1].elements._M_elems + lVar18),
                                       (array<int,_10UL> *)
                                       ((long)((local_2f8._M_current)->elements)._M_elems + lVar18),
                                       true), bVar9)) break;
                this = (vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)
                       (local_140.
                        super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar24);
                paVar27 = (array<int,_10UL> *)
                          ((long)((_Var28._M_current)->elements)._M_elems + lVar18);
                iVar3._M_current = *(array<int,_10UL> **)(this + 8);
                if (iVar3._M_current == *(array<int,_10UL> **)(this + 0x10)) {
                  std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
                  _M_realloc_insert<std::array<int,10ul>const&>(this,iVar3,paVar27);
                }
                else {
                  *(undefined8 *)((iVar3._M_current)->_M_elems + 8) =
                       *(undefined8 *)(paVar27->_M_elems + 8);
                  uVar5 = *(undefined8 *)paVar27->_M_elems;
                  uVar6 = *(undefined8 *)(paVar27->_M_elems + 2);
                  uVar7 = *(undefined8 *)(paVar27->_M_elems + 6);
                  *(undefined8 *)((iVar3._M_current)->_M_elems + 4) =
                       *(undefined8 *)(paVar27->_M_elems + 4);
                  *(undefined8 *)((iVar3._M_current)->_M_elems + 6) = uVar7;
                  *(undefined8 *)(iVar3._M_current)->_M_elems = uVar5;
                  *(undefined8 *)((iVar3._M_current)->_M_elems + 2) = uVar6;
                  *(long *)(this + 8) = *(long *)(this + 8) + 0x28;
                }
                this_00 = (vector<int,std::allocator<int>> *)
                          (local_1f0.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar24);
                piVar13 = (int *)((long)(&(local_2f8._M_current)->elements + 1) + lVar18);
                __position._M_current = *(int **)(this_00 + 8);
                if (__position._M_current == *(int **)(this_00 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (this_00,__position,piVar13);
                }
                else {
                  *__position._M_current = *piVar13;
                  *(int **)(this_00 + 8) = __position._M_current + 1;
                }
                uVar26 = uVar26 + 1;
                lVar18 = lVar18 + 0x2c;
                _Var28._M_current = local_2f8._M_current;
              } while (uVar26 < (ulong)(((long)iStack_2f0._M_current - (long)local_2f8._M_current >>
                                        2) * 0x2e8ba2e8ba2e8ba3));
            }
            if (_Var28._M_current != (labeled_pattern_edge *)0x0) {
              operator_delete(_Var28._M_current);
            }
            std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_128);
            std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_2d8);
          }
          uVar25 = (ulong)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_270];
          local_230 = local_270 * 3;
          paVar12 = local_140.
                    super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_270].
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar26 = ((long)local_140.
                          super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_270].
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)paVar12 >> 3) *
                   -0x3333333333333333;
          if (uVar25 <= uVar26 && uVar26 - uVar25 != 0) {
            local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[local_270] =
                 local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_270] + 1;
            paVar27 = paVar12 + uVar25;
            if (local_288.
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_288.
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
              _M_realloc_insert<std::array<int,10ul>const&>
                        ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)
                         &local_288,
                         (iterator)
                         local_288.
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,paVar27);
            }
            else {
              *(undefined8 *)
               ((local_288.
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->_M_elems + 8) =
                   *(undefined8 *)(paVar27->_M_elems + 8);
              uVar5 = *(undefined8 *)paVar27->_M_elems;
              uVar6 = *(undefined8 *)(paVar27->_M_elems + 2);
              uVar7 = *(undefined8 *)(paVar27->_M_elems + 6);
              *(undefined8 *)
               ((local_288.
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->_M_elems + 4) =
                   *(undefined8 *)(paVar27->_M_elems + 4);
              *(undefined8 *)
               ((local_288.
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->_M_elems + 6) = uVar7;
              *(undefined8 *)
               (local_288.
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish)->_M_elems = uVar5;
              *(undefined8 *)
               ((local_288.
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->_M_elems + 2) = uVar6;
              local_288.
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_288.
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar24 = local_270;
            mVar2 = (edge_list->
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_start
                    [local_1f0.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_270].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar25]]._M_elems[0];
            pmVar11 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_d8,
                                 local_140.
                                 super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[local_270].
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar25]._M_elems);
            *pmVar11 = mVar2;
            mVar2 = (edge_list->
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_start
                    [local_1f0.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar24].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar25]]._M_elems[1];
            pmVar11 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_d8,
                                 local_140.
                                 super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar24].
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar25]._M_elems + 1);
            *pmVar11 = mVar2;
            pmVar11 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_198,
                                 (edge_list->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [(&((local_1f0.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start)[local_230][uVar25]]._M_elems);
            *pmVar11 = *pmVar11 + 1;
            pmVar11 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_198,
                                 (edge_list->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [(&((local_1f0.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start)[local_230][uVar25]]._M_elems +
                                 1);
            *pmVar11 = *pmVar11 + 1;
            iVar22 = (&((local_1f0.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start)[local_230][uVar25];
            uVar21 = (ulong)iVar22;
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[local_270] = iVar22;
            uVar17 = uVar21 + 0x3f;
            if (-1 < (long)uVar21) {
              uVar17 = uVar21;
            }
            local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [((long)uVar17 >> 6) + ((ulong)((uVar21 & local_238) < 0x8000000000000001) - 1)] =
                 local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar17 >> 6) + ((ulong)((uVar21 & local_238) < 0x8000000000000001) - 1)] |
                 1L << ((byte)iVar22 & 0x3f);
            iVar22 = (int)(uVar15 + iVar22) % iVar8;
            uVar21 = (ulong)iVar22;
            uVar17 = uVar21 + 0x3f;
            if (-1 < (long)uVar21) {
              uVar17 = uVar21;
            }
            local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [((long)uVar17 >> 6) + ((ulong)((uVar21 & local_238) < 0x8000000000000001) - 1)] =
                 local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar17 >> 6) + ((ulong)((uVar21 & local_238) < 0x8000000000000001) - 1)] |
                 1L << ((byte)iVar22 & 0x3f);
            local_264 = local_264 + 1;
            __return_storage_ptr__ = local_1a0;
          }
          iVar22 = local_264;
          if (uVar26 < uVar25 || uVar26 - uVar25 == 0) {
            lVar24 = (long)local_264;
            local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar24] = 0;
            pmVar11 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_d8,
                                 local_288.
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems);
            local_2d8._M_impl.super__Deque_impl_data._M_map =
                 (_Map_pointer)
                 CONCAT44(local_2d8._M_impl.super__Deque_impl_data._M_map._4_4_,*pmVar11);
            pmVar11 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_d8,
                                 local_288.
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems + 1);
            local_128._M_impl.super__Deque_impl_data._M_map =
                 (_Map_pointer)
                 CONCAT44(local_128._M_impl.super__Deque_impl_data._M_map._4_4_,*pmVar11);
            pmVar11 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_198,(key_type *)&local_2d8);
            *pmVar11 = *pmVar11 + -1;
            pmVar11 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_198,(key_type *)&local_128);
            *pmVar11 = *pmVar11 + -1;
            local_288.
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_288.
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
            iVar23 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar24];
            uVar26 = (ulong)iVar23;
            if (uVar26 != 0xffffffffffffffff) {
              uVar25 = uVar26 + 0x3f;
              if (-1 < (long)uVar26) {
                uVar25 = uVar26;
              }
              bVar4 = (byte)iVar23 & 0x3f;
              local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p
              [((long)uVar25 >> 6) + ((ulong)((uVar26 & local_238) < 0x8000000000000001) - 1)] =
                   local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar25 >> 6) + ((ulong)((uVar26 & local_238) < 0x8000000000000001) - 1)]
                   & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
              iVar23 = (int)(uVar15 + iVar23) % iVar8;
              uVar25 = (ulong)iVar23;
              uVar26 = uVar25 + 0x3f;
              if (-1 < (long)uVar25) {
                uVar26 = uVar25;
              }
              bVar4 = (byte)iVar23 & 0x3f;
              local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p
              [((long)uVar26 >> 6) + ((ulong)((uVar25 & local_238) < 0x8000000000000001) - 1)] =
                   local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar26 >> 6) + ((ulong)((uVar25 & local_238) < 0x8000000000000001) - 1)]
                   & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar24] = -1;
            }
            iVar22 = iVar22 + -1;
          }
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(&local_d8);
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(&local_198);
        if (local_228 != (void *)0x0) {
          operator_delete(local_228);
        }
        if (local_208 != (void *)0x0) {
          operator_delete(local_208);
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&local_1f0);
        std::
        vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
        ::~vector(&local_140);
        if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
        if (local_288.
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_288.
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      piVar16 = local_98 + 1;
    } while (piVar16 != local_a0);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::array<int, 10>> compute_min_code(std::vector<std::array<int, 10>> edge_list)
    {

        //here we will eventually save the minimum code
        //at the end, we compare it with the current code and decide
        std::vector<std::array<int, 10>> minimum_code;


        int n_edges = edge_list.size();
        for (int i = 0; i < n_edges; i++)
        {
            edge_list.push_back(flipPatternEdge(edge_list[i]));
        }

        std::vector<std::array<int, 8>> starting_edges;

        std::vector<int> indices_of_min_edges = find_minimum_labelings(edge_list, starting_edges, true);

        for (int min_edge_ind : indices_of_min_edges)
        {
            std::array<int, 10> built_min_code_edge = {0, 1, edge_list[min_edge_ind][2], edge_list[min_edge_ind][3],
                                                       edge_list[min_edge_ind][4],
                                                       edge_list[min_edge_ind][5], edge_list[min_edge_ind][6],
                                                       edge_list[min_edge_ind][7], edge_list[min_edge_ind][8],
                                                       edge_list[min_edge_ind][9]};

            // if we already have some min code saved, try to compare the current pattern being built
            // if the current min code is smaller, then just try another init edge
            if (minimum_code.size() > 0 && is_pattern_edge_smaller_than(minimum_code[0], built_min_code_edge, true))
            {
                continue;
            }

            std::vector<std::array<int, 10>> built_min_code;
            built_min_code.push_back(built_min_code_edge);


            std::vector<bool> selected_edges(2 * n_edges, false);
            std::vector<int> selected_edges_ind(n_edges, -1);

            std::vector<int> selected_candidates(n_edges,
                                                 0);  // which candidate was chosen for each edge (used for backtracking)
            // which candidates are possible for each edge (used for backtracking), we are not interested in the 1st element
            std::vector<std::vector<std::array<int, 10>>> all_edge_candidates(n_edges,
                                                                              std::vector<std::array<int, 10>>());
            std::vector<std::vector<int>> all_edge_candidates_selected_edges_ind(n_edges, std::vector<int>());

            selected_edges_ind[0] = min_edge_ind;
            selected_edges[min_edge_ind] = true;  // set the first edge as occupied
            selected_edges[(min_edge_ind + n_edges) %
                           (2 * n_edges)] = true;  // the reversed direction of the edge will be also occupied

            int current_index = 1;

            std::vector<int> src_vertices;
            std::vector<int> dst_vertices;

            // how many edges in built_min_code use the vertices?
            std::map<int, int> amount_of_usage_of_original_vertices;

            // here we keep the mapping of min_code ids to edge_list vertex ids:
            std::map<int, int> vertex_id_mapping;
            vertex_id_mapping[0] = edge_list[min_edge_ind][0];
            vertex_id_mapping[1] = edge_list[min_edge_ind][1];

            for (int i = 0; i < edge_list.size(); i++)
            {
                src_vertices.push_back(edge_list[i][0]);
                dst_vertices.push_back(edge_list[i][1]);
                // all nodes are used 0-times at first
                amount_of_usage_of_original_vertices[edge_list[i][0]] = 0;
                amount_of_usage_of_original_vertices[edge_list[i][1]] = 0;
            }

            // we occupied the first two nodes:
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][0]] = 1;
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][1]] = 1;

            // do DFS
            while (true)
            {
                if (current_index >= n_edges)
                {
                    // we generated a code from all edges

                    // we did not generate a smaller code,
                    // try different code (the next one may be even smaller)
                    if (minimum_code.size() == 0)
                    {
                        // just save this first code as minimum
                        minimum_code = built_min_code;
                    }
                    else
                    {
                        // compare it with the latest "minimum code" and if necessary, save the new one:
                        bool is_new_code_smaller = is_code_smaller_than(built_min_code, minimum_code, true);
                        if (is_new_code_smaller)
                        {
                            minimum_code = built_min_code;
                        }
                    }
                    // backtrack
                    current_index--;

                }
                if (current_index == 0)
                {
                    // (we have tried all posibilities from the current initial edge)
                    // we backtracked back to 0, we should start finding the minimum code from other position (break the repeat loop)
                    // (we couldn't find it here)
                    break;
                }

                // we just moved by one edge, find all candidates for growing the the pattern:
                if (selected_candidates[current_index] == 0)
                {
                    std::deque<int> right_most_path = find_rightmost_path(built_min_code);
                    std::deque<int> right_most_path_occurrence;
                    for (int i = 0; i < right_most_path.size(); i++)
                    {
                        right_most_path_occurrence.push_back(vertex_id_mapping[right_most_path[i]]);
                    }
                    int right_most_vertex = right_most_path_occurrence.back();

                    std::vector<labeled_pattern_edge> edge_candidates;

                    // find backward edge candidates:
                    int src = right_most_vertex;
                    for (int i = 0; i < right_most_path.size() - 1; i++)
                    {
                        int dst = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src && dst_vertices[j] == dst)
                            {

                                std::array<int, 10> e_cand = {right_most_path.back(), right_most_path[i],
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};


                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    // find forward edge candidates:
                    for (int i = right_most_path.size() - 1; i >= 0; i--)
                    {
                        src = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src &&
                                amount_of_usage_of_original_vertices[dst_vertices[j]] == 0)
                            {
                                std::array<int, 10> e_cand = {right_most_path[i], right_most_path.back() + 1,
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};


                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    std::sort(edge_candidates.begin(), edge_candidates.end(), cmp_labeled_pattern_edge);

                    all_edge_candidates[current_index].clear();
                    all_edge_candidates_selected_edges_ind[current_index].clear();
                    for (size_t i = 0; i < edge_candidates.size(); i++)
                    {
                        if (i > 0 &&
                            is_pattern_edge_smaller_than(edge_candidates[i - 1].elements, edge_candidates[i].elements,
                                                         true))
                        {
                            // don't take candidates that cannot have smaller code
                            break;
                        }
                        all_edge_candidates[current_index].push_back(edge_candidates[i].elements);
                        all_edge_candidates_selected_edges_ind[current_index].push_back(edge_candidates[i].index);
                    }
                }


                // try to use the candidates

                bool should_backtrack = true;
                for (int edge_candidate_ind = selected_candidates[current_index];
                     edge_candidate_ind < all_edge_candidates[current_index].size(); edge_candidate_ind++)
                {


                    //if (minimum_code.size() > 0 && is_pattern_edge_smaller_than(minimum_code[current_index], all_edge_candidates[current_index][edge_candidate_ind], true))
                    //{
                    //	// we should backtrack
                    //	break;
                    //}

                    //if (is_pattern_edge_equal_to(all_edge_candidates[current_index][edge_candidate_ind], edge_list[current_index], true))
                    //{
                    // they are same, so append it and move to other edge
                    // NOTE: there can be several edges with the same code (if necessary, these must be tested later as well)
                    selected_candidates[current_index] = edge_candidate_ind + 1;
                    built_min_code.push_back(all_edge_candidates[current_index][edge_candidate_ind]);

                    vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][0]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0];
                    vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][1]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1];

                    amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0]] += 1;
                    amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1]] += 1;

                    int sel_e_ind = all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind];
                    selected_edges_ind[current_index] = sel_e_ind;
                    selected_edges[sel_e_ind] = true;
                    selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = true;

                    current_index++;
                    should_backtrack = false;
                    break;
                    //}
                }

                // the candidate edge made larger code or we don't have more candidates to try:
                if (should_backtrack)
                {
                    selected_candidates[current_index] = 0;

                    // now we need to decrement the usage of these two vertices:
                    int decremented1 = vertex_id_mapping[built_min_code.back()[0]];
                    int decremented2 = vertex_id_mapping[built_min_code.back()[1]];
                    amount_of_usage_of_original_vertices[decremented1] -= 1;
                    amount_of_usage_of_original_vertices[decremented2] -= 1;

                    built_min_code.pop_back();

                    int sel_e_ind = selected_edges_ind[current_index];
                    if (sel_e_ind != -1)
                    {
                        selected_edges[sel_e_ind] = false;
                        selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = false;
                        selected_edges_ind[current_index] = -1;
                    }

                    current_index--;
                }
            }

        }

        // we could not find a smaller code
        return minimum_code;
    }